

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream_p.h
# Opt level: O3

bool QtPrivate::operator!=(XmlStringRef *lhs,XmlStringRef *rhs)

{
  bool bVar1;
  char16_t *pcVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  QStringView rhs_00;
  QStringView lhs_00;
  
  if (lhs->m_string == (QString *)0x0) {
    qVar5 = 0;
    pcVar2 = (char16_t *)0x0;
  }
  else {
    pcVar2 = (lhs->m_string->d).ptr;
    if (pcVar2 == (char16_t *)0x0) {
      pcVar2 = &QString::_empty;
    }
    qVar5 = lhs->m_size;
    pcVar2 = pcVar2 + lhs->m_pos;
  }
  if (rhs->m_string == (QString *)0x0) {
    qVar4 = 0;
    pcVar3 = (char16_t *)0x0;
  }
  else {
    pcVar3 = (rhs->m_string->d).ptr;
    if (pcVar3 == (char16_t *)0x0) {
      pcVar3 = &QString::_empty;
    }
    qVar4 = rhs->m_size;
    pcVar3 = pcVar3 + rhs->m_pos;
  }
  bVar1 = true;
  if (qVar5 == qVar4) {
    rhs_00.m_data = pcVar3;
    rhs_00.m_size = qVar5;
    lhs_00.m_data = pcVar2;
    lhs_00.m_size = qVar5;
    bVar1 = equalStrings(lhs_00,rhs_00);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

QStringView view() const { return m_string ? QStringView(m_string->data() + m_pos, m_size) : QStringView(); }